

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  ushort uVar1;
  short sVar2;
  int temp2;
  ValueType temp;
  Value *other_local;
  Value *this_local;
  
  uVar1 = *(ushort *)&this->field_0x8;
  *(ushort *)&this->field_0x8 =
       *(ushort *)&this->field_0x8 & 0xff00 | *(ushort *)&other->field_0x8 & 0xff;
  *(ushort *)&other->field_0x8 = *(ushort *)&other->field_0x8 & 0xff00 | uVar1 & 0xff;
  std::swap<Json::Value::ValueHolder>(&this->value_,&other->value_);
  sVar2 = *(short *)&this->field_0x8;
  *(ushort *)&this->field_0x8 =
       *(ushort *)&this->field_0x8 & 0xfeff |
       ((short)(*(short *)&other->field_0x8 << 7) >> 0xf & 1U) << 8;
  *(ushort *)&other->field_0x8 =
       *(ushort *)&other->field_0x8 & 0xfeff | ((short)(sVar2 << 7) >> 0xf & 1U) << 8;
  std::swap<unsigned_long>(&this->start_,&other->start_);
  std::swap<unsigned_long>(&this->limit_,&other->limit_);
  return;
}

Assistant:

void Value::swap(Value& other) {
  ValueType temp = type_;
  type_ = other.type_;
  other.type_ = temp;
  std::swap(value_, other.value_);
  int temp2 = allocated_;
  allocated_ = other.allocated_;
  other.allocated_ = temp2;
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}